

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

Entry * __thiscall
Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntryToInsert
          (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          uint *key)

{
  uint uVar1;
  Entry *pEVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  byte local_14 [4];
  
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  uVar1 = 0x811c9dc5;
  lVar3 = 0;
  do {
    uVar1 = (local_14[lVar3] ^ uVar1) * 0x1000193;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  uVar4 = (ulong)uVar1 % (ulong)(uint)this->_capacity;
  pEVar2 = this->_entries + (int)uVar4;
  uVar1 = this->_entries[(int)uVar4].field_0._infoData;
  if ((uVar1 >> 2 == this->_timestamp) && (pEVar2->_key != *key)) {
    (pEVar2->field_0)._infoData = uVar1 | 2;
    uVar1 = *key % (uint)this->_capacity;
    do {
      uVar4 = (ulong)((int)uVar4 + uVar1 + (uVar1 == 0)) % (ulong)(uint)this->_capacity;
      pEVar2 = this->_entries + (int)uVar4;
      if ((uint)this->_entries[(int)uVar4].field_0._infoData >> 2 != this->_timestamp) {
        return pEVar2;
      }
    } while (pEVar2->_key != *key);
  }
  return pEVar2;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }